

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetJacFn(void *ida_mem,IDALsJacFn jac)

{
  long in_RSI;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  IDAMem local_20;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(IDALsMem *)0x11b879);
  if (local_4 == 0) {
    if ((in_RSI == 0) || (*(long *)((long)in_stack_ffffffffffffffd8 + 0x28) != 0)) {
      if (in_RSI == 0) {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 8) = 1;
        *(code **)((long)in_stack_ffffffffffffffd8 + 0x10) = idaLsDQJac;
        *(IDAMem *)((long)in_stack_ffffffffffffffd8 + 0x18) = local_20;
      }
      else {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 8) = 0;
        *(long *)((long)in_stack_ffffffffffffffd8 + 0x10) = in_RSI;
        *(void **)((long)in_stack_ffffffffffffffd8 + 0x18) = local_20->ida_user_data;
      }
      local_4 = 0;
    }
    else {
      IDAProcessError(local_20,-3,0x130,"IDASetJacFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                      ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int IDASetJacFn(void* ida_mem, IDALsJacFn jac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (idals_mem->J == NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (IDALS_ILL_INPUT);
  }

  /* set Jacobian routine pointer, and update relevant flags */
  if (jac != NULL)
  {
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = jac;
    idals_mem->J_data = IDA_mem->ida_user_data;
  }
  else
  {
    idals_mem->jacDQ  = SUNTRUE;
    idals_mem->jac    = idaLsDQJac;
    idals_mem->J_data = IDA_mem;
  }

  return (IDALS_SUCCESS);
}